

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  bool bVar1;
  Int32 IVar2;
  uint uVar3;
  char *pcVar4;
  String *this_00;
  int in_EDX;
  Int32 shard_index;
  char *filter;
  bool in_stack_000000ff;
  char *in_stack_00000100;
  char *in_stack_00000108;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  String local_58;
  Int32 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(in_EDX + 1));
  }
  pcVar4 = String::c_str((String *)FLAGS_gtest_filter);
  bVar1 = String::CStringEquals
                    ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (char *)0x246668);
  if (!bVar1) {
    ColoredPrintf(COLOR_YELLOW,"Note: %s filter = %s\n","Google Test",pcVar4);
  }
  bVar1 = ShouldShard(in_stack_00000108,in_stack_00000100,in_stack_000000ff);
  if (bVar1) {
    IVar2 = Int32FromEnvOrDie(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    pcVar4 = posix::GetEnv((char *)0x2466d2);
    ColoredPrintf(COLOR_YELLOW,"Note: This is test shard %d of %s.\n",(ulong)(IVar2 + 1),pcVar4);
  }
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    uVar3 = UnitTest::random_seed((UnitTest *)0x2466ff);
    ColoredPrintf(COLOR_YELLOW,"Note: Randomizing tests\' orders with a seed of %d .\n",(ulong)uVar3
                 );
  }
  ColoredPrintf(COLOR_GREEN,"[==========] ");
  UnitTest::test_to_run_count((UnitTest *)0x246731);
  FormatTestCount(in_stack_ffffffffffffff7c);
  pcVar4 = String::c_str((String *)&stack0xffffffffffffffc8);
  UnitTest::test_case_to_run_count((UnitTest *)0x24675d);
  FormatTestCaseCount(in_stack_ffffffffffffff7c);
  this_00 = (String *)String::c_str(&local_58);
  printf("Running %s from %s.\n",pcVar4,this_00);
  String::~String(this_00);
  String::~String(this_00);
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  const char* const filter = GTEST_FLAG(filter).c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!internal::String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: %s filter = %s\n", GTEST_NAME_, filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const Int32 shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(COLOR_YELLOW,
                  "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG(shuffle)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  fflush(stdout);
}